

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::~Codegen(Codegen *this)

{
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  *unaff_retaddr;
  
  std::
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  ::~map((map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
          *)0x1d487f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)unaff_retaddr);
  std::
  map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
  ::~map((map<mir::inst::VarId,_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_int>_>_>
          *)0x1d48a1);
  std::
  unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                    *)0x1d48b2);
  std::
  unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::~unordered_map((unordered_map<mir::inst::VarId,_unsigned_int,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
                    *)0x1d48c3);
  std::
  unordered_map<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  ::~unordered_map((unordered_map<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                    *)0x1d48d4);
  std::
  unordered_map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
  ::~unordered_map((unordered_map<int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>_>_>_>
                    *)0x1d48e5);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_arm::ConstValue>_>_>
          *)0x1d48f3);
  std::
  map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
  ::~map((map<mir::inst::VarId,_unsigned_int,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_unsigned_int>_>_>
          *)0x1d4901);
  std::
  vector<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ::~vector(unaff_retaddr);
  return;
}

Assistant:

Codegen(mir::inst::MirFunction& func, mir::inst::MirPackage& package,
          std::map<std::string, std::any>& extra_data,
          bool enable_cond_exec = true)
      : func(func),
        package(package),
        extra_data(extra_data),
        inst(),
        reg_map(),
        fixed_vars(),
        var_collapse(),
        bb_ordering(),
        enable_cond_exec(enable_cond_exec) {
    {
      // Calculate ordering
      auto any_ordering =
          extra_data.find(optimization::BASIC_BLOCK_ORDERING_DATA_NAME);
      if (any_ordering != extra_data.end()) {
        auto& order_map = std::any_cast<optimization::BasicBlockOrderingType&>(
            any_ordering->second);
        auto o = order_map.find(func.name);
        if (o != order_map.end()) {
          LOG(TRACE) << "Found order map for " << func.name << " with "
                     << o->second.size() << " elements" << std::endl;
          auto& ordering = o->second;
          this->bb_ordering.insert(bb_ordering.end(), ordering.begin(),
                                   ordering.end());
        } else {
          LOG(TRACE) << "Cannot find order map for " << func.name << " (1)"
                     << std::endl;
          for (auto& a : func.basic_blks) {
            bb_ordering.push_back(a.first);
          }
        }
      } else {
        LOG(TRACE) << "Cannot find order map for " << func.name << " (2)"
                   << std::endl;
        for (auto& a : func.basic_blks) {
          bb_ordering.push_back(a.first);
        }
      }
    }
    auto inline_hint = extra_data.find(optimization::inline_blks);
    if (inline_hint != extra_data.end()) {
      LOG(TRACE) << "Found inline hint in extra data" << std::endl;

      this->inline_hint =
          std::any_cast<optimization::InlineBlksType&>(inline_hint->second)
              .at(func.name);

      LOG(TRACE) << "Inline hint has " << this->inline_hint.size()
                 << " items: ";
      for (auto i : this->inline_hint) LOG(TRACE) << i.first << " ";
      LOG(TRACE) << std::endl;
    }
    param_size = func.type->params.size();
  }